

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fossilize_feature_filter.cpp
# Opt level: O3

bool __thiscall
Fossilize::FeatureFilter::Impl::subgroup_size_control_is_supported
          (Impl *this,VkPipelineShaderStageCreateInfo *stage)

{
  uint uVar1;
  VkBool32 VVar2;
  VkShaderStageFlagBits VVar3;
  bool bVar4;
  VkBaseInStructure *sin;
  int *piVar5;
  
  uVar1 = stage->flags;
  if ((uVar1 < 4) &&
     (VVar2 = (this->features).subgroup_size_control.subgroupSizeControl,
     ((byte)uVar1 & VVar2 == 0) == 0)) {
    VVar3 = stage->stage;
    bVar4 = false;
    if ((VVar3 != VK_SHADER_STAGE_COMPUTE_BIT) &&
       ((bVar4 = false, VVar3 != VK_SHADER_STAGE_TASK_BIT_EXT &&
        (bVar4 = false, VVar3 != VK_SHADER_STAGE_MESH_BIT_EXT)))) {
      bVar4 = true;
    }
    if ((uVar1 < 2) ||
       ((!bVar4 && (this->features).subgroup_size_control.computeFullSubgroups != 0) && VVar2 != 0))
    {
      piVar5 = (int *)stage->pNext;
      while( true ) {
        if (piVar5 == (int *)0x0) {
          return true;
        }
        if (*piVar5 == 0x3b9e38e9) break;
        piVar5 = *(int **)(piVar5 + 2);
      }
      if (VVar2 == 0) {
        return false;
      }
      if (((this->props).subgroup_size_control.requiredSubgroupSizeStages & VVar3) == 0) {
        return false;
      }
      if ((uint)piVar5[4] <= (this->props).subgroup_size_control.maxSubgroupSize) {
        if ((this->props).subgroup_size_control.minSubgroupSize <= (uint)piVar5[4]) {
          return true;
        }
        return false;
      }
      return false;
    }
  }
  return false;
}

Assistant:

bool FeatureFilter::Impl::subgroup_size_control_is_supported(const VkPipelineShaderStageCreateInfo &stage) const
{
	constexpr VkPipelineShaderStageCreateFlags supported_flags =
			VK_PIPELINE_SHADER_STAGE_CREATE_ALLOW_VARYING_SUBGROUP_SIZE_BIT |
			VK_PIPELINE_SHADER_STAGE_CREATE_REQUIRE_FULL_SUBGROUPS_BIT;

	if ((stage.flags & ~supported_flags) != 0)
		return false;

	if ((stage.flags & VK_PIPELINE_SHADER_STAGE_CREATE_ALLOW_VARYING_SUBGROUP_SIZE_BIT_EXT) != 0 &&
	    features.subgroup_size_control.subgroupSizeControl == VK_FALSE)
	{
		return false;
	}

	bool is_compute_like_stage =
			stage.stage == VK_SHADER_STAGE_MESH_BIT_EXT ||
			stage.stage == VK_SHADER_STAGE_TASK_BIT_EXT ||
			stage.stage == VK_SHADER_STAGE_COMPUTE_BIT;

	if ((stage.flags & VK_PIPELINE_SHADER_STAGE_CREATE_REQUIRE_FULL_SUBGROUPS_BIT_EXT) != 0 &&
	    (!is_compute_like_stage ||
	     features.subgroup_size_control.computeFullSubgroups == VK_FALSE ||
	     features.subgroup_size_control.subgroupSizeControl == VK_FALSE))
	{
		return false;
	}

	auto *required = find_pnext<VkPipelineShaderStageRequiredSubgroupSizeCreateInfoEXT>(
			VK_STRUCTURE_TYPE_PIPELINE_SHADER_STAGE_REQUIRED_SUBGROUP_SIZE_CREATE_INFO_EXT,
			stage.pNext);

	if (required)
	{
		if (features.subgroup_size_control.subgroupSizeControl == VK_FALSE ||
		    (props.subgroup_size_control.requiredSubgroupSizeStages & stage.stage) == 0 ||
		    required->requiredSubgroupSize > props.subgroup_size_control.maxSubgroupSize ||
		    required->requiredSubgroupSize < props.subgroup_size_control.minSubgroupSize)
		{
			return false;
		}
	}

	return true;
}